

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_true>_> __thiscall
immutable::rrb_details::concat_sub_tree<int,true,5>
          (rrb_details *this,ref<immutable::rrb_details::tree_node<int,_true>_> *left_node,
          uint32_t left_shift,ref<immutable::rrb_details::tree_node<int,_true>_> *right_node,
          uint32_t right_shift,bool is_top)

{
  atomic<unsigned_int> *paVar1;
  ref<immutable::rrb_details::internal_node<int,_true>_> **__s;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined8 *puVar5;
  ulong uVar6;
  char *__function;
  tree_node<int,_true> *__ptr;
  uint uVar7;
  ref<immutable::rrb_details::internal_node<int,_true>_> left_internal;
  ref<immutable::rrb_details::tree_node<int,_true>_> left_node_temp;
  ref<immutable::rrb_details::internal_node<int,_true>_> centre_node;
  ref<immutable::rrb_details::internal_node<int,_true>_> empty;
  ref<immutable::rrb_details::internal_node<int,_true>_> centre_node_2;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_70;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_68;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_60;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_58;
  tree_node<int,_true> *local_50;
  tree_node<int,_true> *local_48;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_40;
  size_t local_38;
  
  if (right_shift < left_shift) {
    local_70.ptr = (internal_node<int,_true> *)left_node->ptr;
    if (local_70.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      local_68.ptr = (local_70.ptr)->child[(local_70.ptr)->len - 1].ptr;
      if (local_68.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((local_68.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((local_68.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      concat_sub_tree<int,true,5>
                ((rrb_details *)&local_60,
                 (ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_68,left_shift - 5,
                 right_node,right_shift,false);
      local_58.ptr = (internal_node<int,_true> *)0x0;
      rebalance<int,true,5>(this,&local_70,&local_60,&local_58,left_shift,is_top);
      release<int>(local_58.ptr);
      release<int>(local_60.ptr);
      ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_68);
      release<int>(local_70.ptr);
      return (ref<immutable::rrb_details::internal_node<int,_true>_>)
             (internal_node<int,_true> *)this;
    }
  }
  else if (left_shift < right_shift) {
    local_70.ptr = (internal_node<int,_true> *)right_node->ptr;
    if (local_70.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      local_68.ptr = (local_70.ptr)->child->ptr;
      if (local_68.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((local_68.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((local_68.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      concat_sub_tree<int,true,5>
                ((rrb_details *)&local_60,left_node,left_shift,
                 (ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_68,right_shift - 5,
                 false);
      local_58.ptr = (internal_node<int,_true> *)0x0;
      rebalance<int,true,5>(this,&local_58,&local_60,&local_70,right_shift,is_top);
      release<int>(local_58.ptr);
      release<int>(local_60.ptr);
      ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_68);
      release<int>(local_70.ptr);
      return (ref<immutable::rrb_details::internal_node<int,_true>_>)
             (internal_node<int,_true> *)this;
    }
  }
  else {
    if (left_shift == 0) {
      __ptr = left_node->ptr;
      if (__ptr != (tree_node<int,_true> *)0x0) {
        LOCK();
        (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      local_48 = right_node->ptr;
      if (local_48 != (tree_node<int,_true> *)0x0) {
        LOCK();
        (local_48->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (local_48->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      if (is_top) {
        if ((__ptr == (tree_node<int,_true> *)0x0) || (local_48 == (tree_node<int,_true> *)0x0)) {
          __function = 
          "T *immutable::ref<immutable::rrb_details::leaf_node<int, true>>::operator->() const [T = immutable::rrb_details::leaf_node<int, true>]"
          ;
          goto LAB_0011a63c;
        }
        uVar2 = __ptr->len;
        uVar3 = local_48->len;
        uVar7 = uVar3 + uVar2;
        if (uVar7 < 0x21) {
          local_38 = (size_t)(uVar7 * 4);
          local_50 = __ptr;
          local_70.ptr = (internal_node<int,_true> *)malloc(local_38 + 0x18);
          (local_70.ptr)->len = uVar7;
          (local_70.ptr)->type = LEAF_NODE;
          __s = &(local_70.ptr)->child;
          ((local_70.ptr)->size_table).ptr = (rrb_size_table<true> *)__s;
          (local_70.ptr)->guid = 0;
          if (uVar7 != 0) {
            memset(__s,0,local_38);
          }
          if ((ulong)uVar2 != 0) {
            lVar4 = *(long *)(local_50 + 1);
            uVar6 = 0;
            do {
              *(undefined4 *)((long)__s + uVar6 * 4) = *(undefined4 *)(lVar4 + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
          }
          if ((ulong)uVar3 != 0) {
            lVar4 = *(long *)(local_48 + 1);
            uVar6 = 0;
            do {
              *(undefined4 *)((long)__s + (ulong)((int)uVar6 + uVar2) * 4) =
                   *(undefined4 *)(lVar4 + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar3 != uVar6);
          }
          LOCK();
          ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
          puVar5 = (undefined8 *)malloc(0x28);
          *puVar5 = 0x100000001;
          puVar5[2] = 0;
          *(undefined4 *)((long)puVar5 + 0xc) = 0;
          puVar5[3] = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5 + 4);
          puVar5[4] = 0;
          ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5 + 4),
                     &local_70);
          *(undefined8 **)this = puVar5;
          LOCK();
          *(undefined4 *)(puVar5 + 1) = 1;
          UNLOCK();
          release<int>(local_70.ptr);
          __ptr = local_50;
          goto LAB_0011a5f1;
        }
      }
      local_70.ptr = (internal_node<int,_true> *)left_node->ptr;
      if (local_70.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      local_68.ptr = (internal_node<int,_true> *)right_node->ptr;
      if (local_68.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((local_68.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((local_68.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      puVar5 = (undefined8 *)malloc(0x30);
      *puVar5 = 0x200000001;
      puVar5[2] = 0;
      *(undefined4 *)((long)puVar5 + 0xc) = 0;
      puVar5[3] = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5 + 4);
      puVar5[4] = 0;
      puVar5[5] = 0;
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5 + 4),&local_70);
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_true>_> *)(puVar5[3] + 8),&local_68
                );
      *(undefined8 **)this = puVar5;
      LOCK();
      *(undefined4 *)(puVar5 + 1) = 1;
      UNLOCK();
      release<int>(local_68.ptr);
      release<int>(local_70.ptr);
LAB_0011a5f1:
      if (local_48 != (tree_node<int,_true> *)0x0) {
        LOCK();
        paVar1 = &local_48->_ref_count;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(local_48);
        }
      }
      if (__ptr != (tree_node<int,_true> *)0x0) {
        LOCK();
        paVar1 = &__ptr->_ref_count;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(__ptr);
        }
      }
      return (ref<immutable::rrb_details::internal_node<int,_true>_>)
             (internal_node<int,_true> *)this;
    }
    local_70.ptr = (internal_node<int,_true> *)left_node->ptr;
    if (local_70.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    local_68.ptr = (internal_node<int,_true> *)right_node->ptr;
    if (local_68.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((local_68.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_68.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    if (local_70.ptr != (internal_node<int,_true> *)0x0) {
      local_60.ptr = (local_70.ptr)->child[(local_70.ptr)->len - 1].ptr;
      if (local_60.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((local_60.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((local_60.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      if (local_68.ptr != (internal_node<int,_true> *)0x0) {
        local_58.ptr = (local_68.ptr)->child->ptr;
        if (local_58.ptr != (internal_node<int,_true> *)0x0) {
          LOCK();
          ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
               ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
        }
        concat_sub_tree<int,true,5>
                  ((rrb_details *)&local_40,
                   (ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_60,left_shift - 5,
                   (ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_58,right_shift - 5,
                   false);
        rebalance<int,true,5>(this,&local_70,&local_40,&local_68,left_shift,is_top);
        release<int>(local_40.ptr);
        ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_58);
        ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_60);
        release<int>(local_68.ptr);
        release<int>(local_70.ptr);
        return (ref<immutable::rrb_details::internal_node<int,_true>_>)
               (internal_node<int,_true> *)this;
      }
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<int, true>>::operator->() const [T = immutable::rrb_details::internal_node<int, true>]"
  ;
LAB_0011a63c:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> concat_sub_tree(const ref<tree_node<T, atomic_ref_counting>>& left_node, uint32_t left_shift, const ref<tree_node<T, atomic_ref_counting>>& right_node, uint32_t right_shift, bool is_top)
      {
      if (left_shift > right_shift)
        {
        // Left tree is higher than right tree
        ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
        ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node, right_shift, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, empty, left_shift, is_top);
        }
      else if (left_shift < right_shift)
        {
        ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
        ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node, left_shift, right_node_temp, right_shift - bits<N>::rrb_bits, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(empty, centre_node, right_internal, right_shift, is_top);
        }
      else
        { // we have same height
        if (left_shift == 0)
          { // We're dealing with leaf nodes
          ref<leaf_node<T, atomic_ref_counting>> left_leaf = left_node;
          ref<leaf_node<T, atomic_ref_counting>> right_leaf = right_node;
          // We don't do this if we're not at top, as we'd have to zip stuff above
          // as well.
          if (is_top && (left_leaf->len + right_leaf->len) <= bits<N>::rrb_branching)
            {
            // Can put them in a single node
            ref<internal_node<T, atomic_ref_counting>> merged = leaf_node_merge<T, atomic_ref_counting>(left_leaf.ptr, right_leaf.ptr);
            return internal_node_new_above1(merged);
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
            ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
            return internal_node_new_above(left_internal, right_internal);
            }
          }
        else
          { // two internal nodes with same height. Move both down
          ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
          ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
          ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
          ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
          ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node_temp, right_shift - bits<N>::rrb_bits, false);
          // can be optimised: since left_shift == right_shift, we'll end up in this
          // block again.
          return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, right_internal, left_shift, is_top);
          }
        }
      }